

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

typed_value<std::vector<float,_std::allocator<float>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<float>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<float>_> *opt)

{
  initializer_list<float> __l;
  bool bVar1;
  undefined8 this_00;
  typed_value<std::vector<float,_std::allocator<float>_>,_char> *ptVar2;
  options_boost_po *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  float fVar3;
  typed_value<std::vector<float,_std::allocator<float>_>,_char> *value;
  undefined4 in_stack_ffffffffffffffb8;
  iterator pfVar4;
  size_type in_stack_ffffffffffffffd0;
  typed_value<std::vector<float,_std::allocator<float>_>,_char> *in_stack_ffffffffffffffe0;
  undefined8 uVar5;
  
  this_00 = boost::program_options::value<std::vector<float,std::allocator<float>>>();
  std::
  __shared_ptr_access<VW::config::typed_option<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<VW::config::typed_option<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x338a4c);
  bVar1 = typed_option<float>::default_value_supplied((typed_option<float> *)0x338a54);
  if (bVar1) {
    uVar5 = this_00;
    std::
    __shared_ptr_access<VW::config::typed_option<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<VW::config::typed_option<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x338a71);
    fVar3 = typed_option<float>::default_value((typed_option<float> *)this_00);
    ptVar2 = (typed_value<std::vector<float,_std::allocator<float>_>,_char> *)
             &stack0xffffffffffffffbc;
    pfVar4 = (iterator)0x1;
    std::allocator<float>::allocator((allocator<float> *)0x338aa1);
    __l._M_len = in_stack_ffffffffffffffd0;
    __l._M_array = pfVar4;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)ptVar2,__l,
               (allocator_type *)CONCAT44(fVar3,in_stack_ffffffffffffffb8));
    boost::program_options::typed_value<std::vector<float,_std::allocator<float>_>,_char>::
    default_value(ptVar2,(vector<float,_std::allocator<float>_> *)
                         CONCAT44(fVar3,in_stack_ffffffffffffffb8));
    std::vector<float,_std::allocator<float>_>::~vector(in_RDI);
    std::allocator<float>::~allocator((allocator<float> *)0x338ae1);
    this_00 = uVar5;
  }
  ptVar2 = add_notifier<float>(in_RSI,(shared_ptr<VW::config::typed_option<float>_> *)this_00,
                               in_stack_ffffffffffffffe0);
  ptVar2 = boost::program_options::typed_value<std::vector<float,_std::allocator<float>_>,_char>::
           composing(ptVar2);
  return ptVar2;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(std::shared_ptr<typed_option<T>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value({opt->default_value()});
  }

  return add_notifier(opt, value)->composing();
}